

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

bool __thiscall cppcms::form::validate(form *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  long in_RDI;
  uint i;
  bool result;
  uint local_10;
  bool local_9;
  
  local_9 = true;
  local_10 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
            ::size((vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                    *)(in_RDI + 8));
    if (sVar2 <= local_10) break;
    pvVar3 = std::
             vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
             ::operator[]((vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                           *)(in_RDI + 8),(ulong)local_10);
    iVar1 = (*pvVar3->first->_vptr_base_form[2])();
    local_9 = ((byte)iVar1 & 1 & local_9) != 0;
    local_10 = local_10 + 1;
  }
  return local_9;
}

Assistant:

bool form::validate() 
{
	bool result=true;
	for(unsigned int i=0;i<elements_.size();i++) {
		result = elements_[i].first->validate() & result;
	}
	return result;
}